

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void jacobi(float (*aa) [2],int n,float *d,float (*v) [2],int *nrot)

{
  float fVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  float local_88 [2];
  float a [2] [2];
  float z [2];
  float b [2];
  float c;
  float g;
  float h;
  float s;
  float sm;
  float t;
  float tau;
  float theta;
  float thresh;
  int i;
  int ip;
  int iq;
  int j;
  int *nrot_local;
  float (*v_local) [2];
  float *d_local;
  float (*pafStack_10) [2];
  int n_local;
  float (*aa_local) [2];
  
  pafStack_10 = aa;
  d_local._4_4_ = n;
  v_local = (float (*) [2])d;
  nrot_local = (int *)v;
  _iq = nrot;
  if (n != 2) {
    fprintf(_stderr,"\nFatal error: n %d not N %d in jacobi\n",(ulong)(uint)n,2);
    exit(1);
  }
  for (thresh = 0.0; (int)thresh < d_local._4_4_; thresh = (float)((int)thresh + 1)) {
    for (i = 0; i < d_local._4_4_; i = i + 1) {
      nrot_local[(long)(int)thresh * 2 + (long)i] = 0;
    }
    for (i = 0; i < d_local._4_4_; i = i + 1) {
      a[(long)(int)thresh + -1][i] = pafStack_10[(int)thresh][i];
    }
    nrot_local[(long)(int)thresh * 2 + (long)(int)thresh] = 0x3f800000;
  }
  for (thresh = 0.0; (int)thresh < d_local._4_4_; thresh = (float)((int)thresh + 1)) {
    fVar1 = a[(long)(int)thresh + -1][(int)thresh];
    (*v_local)[(int)thresh] = fVar1;
    z[(int)thresh] = fVar1;
    a[1][(long)(int)thresh + 1] = 0.0;
  }
  *_iq = 0;
  theta = 0.0;
  while( true ) {
    if (99 < (int)theta) {
      return;
    }
    h = 0.0;
    for (thresh = 0.0; (int)thresh < d_local._4_4_ + -1; thresh = (float)((int)thresh + 1)) {
      for (i = (int)thresh + 1; i < d_local._4_4_; i = i + 1) {
        h = (float)(double)((ulong)(double)a[(long)(int)thresh + -1][i] & (ulong)DAT_001070d0) + h;
      }
    }
    if ((h == 0.0) && (!NAN(h))) break;
    if ((int)theta < 3) {
      tau = (h * 0.2) / (float)(d_local._4_4_ * d_local._4_4_);
    }
    else {
      tau = 0.0;
    }
    for (thresh = 0.0; (int)thresh < d_local._4_4_ + -1; thresh = (float)((int)thresh + 1)) {
      for (i = (int)thresh + 1; i < d_local._4_4_; i = i + 1) {
        b[1] = ABS(a[(long)(int)thresh + -1][i]) * 100.0;
        if (((((int)theta < 4) ||
             (fVar1 = ABS((*v_local)[(int)thresh]) + b[1], fVar1 != ABS((*v_local)[(int)thresh])))
            || (NAN(fVar1) || NAN(ABS((*v_local)[(int)thresh])))) ||
           ((dVar3 = ABS((double)(*v_local)[i]) + (double)b[1],
            dVar4 = (double)((ulong)(double)(*v_local)[i] & (ulong)DAT_001070d0), dVar3 != dVar4 ||
            (NAN(dVar3) || NAN(dVar4))))) {
          if ((double)tau <
              (double)((ulong)(double)a[(long)(int)thresh + -1][i] & (ulong)DAT_001070d0)) {
            c = (*v_local)[i] - (*v_local)[(int)thresh];
            if ((ABS(c) + b[1] != ABS(c)) || (NAN(ABS(c) + b[1]) || NAN(ABS(c)))) {
              t = (c * 0.5) / a[(long)(int)thresh + -1][i];
              dVar3 = (double)t;
              dVar4 = sqrt((double)(t * t) + 1.0);
              s = (float)(1.0 / (ABS(dVar3) + dVar4));
              if (t < 0.0) {
                s = -s;
              }
            }
            else {
              s = a[(long)(int)thresh + -1][i] / c;
            }
            dVar3 = sqrt((double)(s * s) + 1.0);
            b[0] = (float)(1.0 / dVar3);
            g = s * b[0];
            sm = (s * b[0]) / (b[0] + 1.0);
            c = s * a[(long)(int)thresh + -1][i];
            a[1][(long)(int)thresh + 1] = a[1][(long)(int)thresh + 1] - c;
            a[1][(long)i + 1] = c + a[1][(long)i + 1];
            (*v_local)[(int)thresh] = (*v_local)[(int)thresh] - c;
            (*v_local)[i] = c + (*v_local)[i];
            a[(long)(int)thresh + -1][i] = 0.0;
            for (ip = 0; fVar1 = thresh, ip < (int)thresh + -1; ip = ip + 1) {
              rotate(&local_88,ip,(int)thresh,ip,i,&c,b + 1,g,sm);
            }
            while (ip = (int)fVar1 + 1, iVar2 = i, ip < i + -1) {
              rotate(&local_88,(int)thresh,ip,ip,i,&c,b + 1,g,sm);
              fVar1 = (float)ip;
            }
            while (ip = iVar2 + 1, ip < d_local._4_4_) {
              rotate(&local_88,(int)thresh,ip,i,ip,&c,b + 1,g,sm);
              iVar2 = ip;
            }
            for (ip = 0; ip < d_local._4_4_; ip = ip + 1) {
              rotate((float (*) [2])nrot_local,ip,(int)thresh,ip,i,&c,b + 1,g,sm);
            }
            *_iq = *_iq + 1;
          }
        }
        else {
          a[(long)(int)thresh + -1][i] = 0.0;
        }
      }
    }
    for (thresh = 0.0; (int)thresh < d_local._4_4_; thresh = (float)((int)thresh + 1)) {
      z[(int)thresh] = a[1][(long)(int)thresh + 1] + z[(int)thresh];
      (*v_local)[(int)thresh] = z[(int)thresh];
      a[1][(long)(int)thresh + 1] = 0.0;
    }
    theta = (float)((int)theta + 1);
  }
  return;
}

Assistant:

void jacobi(float aa[N][N], int n, float d[N], float v[N][N],
int *nrot)
{
int j,iq,ip,i;
float thresh,theta,tau,t,sm,s,h,g,c;
float b[N],z[N],a[N][N];

if(n!=N) {
    fprintf(stderr,"\nFatal error: n %d not N %d in jacobi\n",n,N);
    exit(EXIT_FAILURE);
    }
for(ip=0;ip<n;ip++) /* Initialize to the identity matrix */
	{
	for(iq=0;iq<n;iq++) v[ip][iq] = 0.0;
	for(iq=0;iq<n;iq++) a[ip][iq] = aa[ip][iq]; /* Don't destroy aa */
	v[ip][ip] = 1.0;
	}
/* Initialize b and d to the diagonals of a */
for(ip=0;ip<n;ip++)
	{
	b[ip] = d[ip] = a[ip][ip];
	z[ip] = 0.0;
	}
*nrot = 0;
for(i=0;i<100;i++)
	{
	sm = 0.0;
	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			sm += (float) fabs(a[ip][iq]);
		}

	/* Normal return, which relies on quadratic convergence to
	   machine underflow */
	if(sm == 0.0) return;

	if(i<3) thresh=(float) (0.2*sm/(n*n)); /* on the first three sweeps */
	else thresh = 0.0; /* the rest of the sweeps */

	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			{
			g = (float)(100.0*fabs(a[ip][iq]));
			/* After 4 sweeps skip the rotation if the
			   off diagonal element is small */
			if(i>3 && fabs(d[ip])+g == fabs(d[ip])
			       && fabs(d[iq])+g == fabs(d[iq])) a[ip][iq] = 0.0;
			else if(fabs(a[ip][iq]) > thresh)
				{
				h = d[iq]-d[ip];
				if(fabs(h)+g==fabs(h)) t=(a[ip][iq])/h;
				else
				  {
				  theta = 0.5f*h/(a[ip][iq]);
				  t = (float)(1.0/(fabs(theta)+sqrt(1.0+theta*theta)));
				  if(theta < 0.0) t = -t;
				  }
				c = (float)(1.0/sqrt(1.0+t*t));
				s = t*c;
				tau = s/(1.0f+c);
				h = t*a[ip][iq];
				z[ip] -= h;
				z[iq] += h;
				d[ip] -= h;
				d[iq] += h;
				a[ip][iq] = 0.0;
				for(j=0;j<ip-1;j++)
					rotate(a,j,ip,j,iq,&h,&g,s,tau);
				for(j=ip+1;j<iq-1;j++)
					rotate(a,ip,j,j,iq,&h,&g,s,tau);
				for(j=iq+1;j<n;j++)
					rotate(a,ip,j,iq,j,&h,&g,s,tau);
				for(j=0;j<n;j++)
					rotate(v,j,ip,j,iq,&h,&g,s,tau);
				++(*nrot);
				}
			}
		}
	for(ip=0;ip<n;ip++)
		{
		b[ip] += z[ip];
		d[ip] = b[ip];
		z[ip] = 0.0;
		}
	}
/* fprintf(stderr,"\nFatal error: too many iterations in jacobi\n"); */
}